

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

QDBusCustomTypeInfo * __thiscall
QHash<int,_QDBusCustomTypeInfo>::operator[](QHash<int,_QDBusCustomTypeInfo> *this,int *key)

{
  long in_FS_OFFSET;
  TryEmplaceResult local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<int,QDBusCustomTypeInfo>::tryEmplace_impl<int_const&>(&local_28,this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QDBusCustomTypeInfo *)
           ((((local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].entries)->storage).
            data + (ulong)((uint)(local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].
                                 offsets[(uint)local_28.iterator.i.bucket & 0x7f] * 0x30) + 8);
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }